

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

uint __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_int>,unsigned_int>
          (STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  STInteger<unsigned_int> *local_48;
  STInteger<unsigned_int> *cf;
  SerializedTypeID id;
  STBase *rf;
  SField *field_local;
  STObject *this_local;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])();
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (pSVar2 == (STBase *)0x0) {
      local_48 = (STInteger<unsigned_int> *)0x0;
    }
    else {
      local_48 = (STInteger<unsigned_int> *)
                 __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    }
    if (local_48 == (STInteger<unsigned_int> *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    this_local._4_4_ = STInteger<unsigned_int>::value(local_48);
  }
  return this_local._4_4_;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }